

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

ptr<resp_msg> __thiscall nuraft::raft_server::handle_add_srv_req(raft_server *this,req_msg *req)

{
  msg_type *__args_1;
  pointer psVar1;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  buffer *buf;
  iterator iVar5;
  uint64_t uVar6;
  ulong uVar7;
  _func_int *p_Var8;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  shared_ptr<nuraft::resp_msg> sVar10;
  ptr<resp_msg> pVar11;
  executor exec;
  ptr<srv_config> srv_conf;
  undefined1 local_40 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  exec.super__Function_base._M_functor._M_unused._M_object = req[9].super_msg_base._vptr_msg_base[1]
  ;
  local_40._0_4_ = 7;
  sVar10 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,std::atomic<int>&>
                     ((unsigned_long *)this,(msg_type *)&exec,(int *)local_40,
                      (atomic<int> *)&req->log_entries_);
  _Var9 = sVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) != 0x10) ||
     (*(char *)(**(long **)(in_RDX + 0x38) + 8) != '\x03')) {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 != (pointer)0x0) {
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var9._M_pi = extraout_RDX_01;
      if (4 < iVar4) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&exec,
                   "bad add server request as we are expecting one log entry with value type of ClusterServer"
                  );
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_add_srv_req",0x30,&exec);
        std::__cxx11::string::~string((string *)&exec);
        _Var9._M_pi = extraout_RDX_02;
      }
    }
    *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffc;
    goto LAB_001359ce;
  }
  if ((*(int *)&req[8].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 3) ||
     (((ulong)req[3].super_msg_base._vptr_msg_base & 1) != 0)) {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 != (pointer)0x0) {
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var9._M_pi = extraout_RDX;
      if (1 < iVar4) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&exec,"this is not a leader, cannot handle AddServerRequest");
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_add_srv_req",0x36,&exec);
        std::__cxx11::string::~string((string *)&exec);
        _Var9._M_pi = extraout_RDX_00;
      }
    }
    *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffd;
    goto LAB_001359ce;
  }
  check_srv_to_leave_timeout((raft_server *)req);
  buf = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
  srv_config::deserialize((srv_config *)&srv_conf,buf);
  exec.super__Function_base._M_functor._0_4_ =
       (srv_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
  iVar5 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(req + 6),(key_type_conflict *)&exec);
  if ((iVar5.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
       _M_cur == (__node_type *)0x0) &&
     (*(int *)&(req->log_entries_).
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
      (srv_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_)) {
    if (*(char *)((long)&req[2].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\x01') {
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar1 != (pointer)0x0) {
        iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
        if (2 < iVar4) {
          psVar1 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_((string *)&exec,"previous config has not committed yet");
          (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar1,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_add_srv_req",0x4a,&exec);
          std::__cxx11::string::~string((string *)&exec);
        }
      }
      *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffa;
    }
    else {
      if (req[0xb].commit_idx_ != 0) {
        uVar6 = timer_helper::get_us((timer_helper *)(req[0xb].commit_idx_ + 0x180));
        uVar7 = uVar6 / 1000;
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar1 != (pointer)0x0) {
          iVar4 = (*(code *)(psVar1->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (2 < iVar4) {
            psVar1 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)&exec,
                       "previous adding server (%d) is in progress, last activity: %lu ms ago",
                       (ulong)**(uint **)req[0xb].commit_idx_,uVar7);
            (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar1,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_add_srv_req",0x57,&exec);
            std::__cxx11::string::~string((string *)&exec);
          }
        }
        iVar3 = DAT_00184530;
        context::get_params((context *)&exec);
        iVar4 = *(int *)(exec.super__Function_base._M_functor._M_unused._M_function_pointer + 8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&exec.super__Function_base._M_functor + 8));
        if (uVar7 <= (ulong)((long)iVar4 * (long)iVar3)) {
          *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff9;
          goto LAB_00135aa1;
        }
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar1 != (pointer)0x0) {
          iVar4 = (*(code *)(psVar1->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (2 < iVar4) {
            psVar1 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)&exec,"activity timeout (last activity %lu ms ago), start over",
                       uVar7);
            (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar1,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_add_srv_req",0x61,&exec);
            std::__cxx11::string::~string((string *)&exec);
          }
        }
        reset_srv_to_join((raft_server *)req);
      }
      __args_1 = &req[0xc].super_msg_base.type_;
      std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)__args_1,
                 &srv_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>);
      local_40 = (undefined1  [8])handle_hb_timeout;
      local_38._M_allocated_capacity = 0;
      local_38._8_8_ = req;
      std::function<void(int)>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>))(int)>,void>
                ((function<void(int)> *)&exec,
                 (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>
                  *)local_40);
      std::
      make_shared<nuraft::peer,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
                ((shared_ptr<nuraft::srv_config> *)local_40,(context *)__args_1,
                 *(function<void_(int)> **)&req[4].super_msg_base.dst_,
                 (shared_ptr<nuraft::logger> *)&exec);
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)&req[0xb].commit_idx_,
                 (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
      invite_srv_to_join_cluster((raft_server *)req);
      pp_Var2 = this->_vptr_raft_server;
      p_Var8 = (_func_int *)(**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      pp_Var2[4] = p_Var8;
      *(undefined1 *)(pp_Var2 + 6) = 1;
      std::_Function_base::~_Function_base(&exec.super__Function_base);
    }
  }
  else {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 != (pointer)0x0) {
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (2 < iVar4) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&exec,
                   "the server to be added has a duplicated id with existing server %d",
                   (ulong)(uint)(srv_conf.
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_add_srv_req",0x43,&exec);
        std::__cxx11::string::~string((string *)&exec);
      }
    }
    *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffb;
  }
LAB_00135aa1:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srv_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var9._M_pi = extraout_RDX_03;
LAB_001359ce:
  pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_add_srv_req(req_msg& req) {
    std::vector< ptr<log_entry> >& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::add_server_response,
                           id_,
                           leader_ );

    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::cluster_server ) {
        p_db( "bad add server request as we are expecting one log entry "
              "with value type of ClusterServer" );
        resp->set_result_code(cmd_result_code::BAD_REQUEST);
        return resp;
    }

    if (role_ != srv_role::leader || write_paused_) {
        p_er("this is not a leader, cannot handle AddServerRequest");
        resp->set_result_code(cmd_result_code::NOT_LEADER);
        return resp;
    }

    // Before checking duplicate ID, confirm srv_to_leave_ is gone.
    check_srv_to_leave_timeout();
    ptr<srv_config> srv_conf =
        srv_config::deserialize( entries[0]->get_buf() );
    if ( peers_.find( srv_conf->get_id() ) != peers_.end() ||
         id_ == srv_conf->get_id() ) {
        p_wn( "the server to be added has a duplicated "
              "id with existing server %d",
              srv_conf->get_id() );
        resp->set_result_code(cmd_result_code::SERVER_ALREADY_EXISTS);
        return resp;
    }

    if (config_changing_) {
        // the previous config has not committed yet
        p_wn("previous config has not committed yet");
        resp->set_result_code(cmd_result_code::CONFIG_CHANGING);
        return resp;
    }

    if (srv_to_join_) {
        // Adding server is already in progress.

        // Check the last active time of that server.
        ulong last_active_ms = srv_to_join_->get_active_timer_us() / 1000;
        p_wn("previous adding server (%d) is in progress, "
             "last activity: %" PRIu64 " ms ago",
             srv_to_join_->get_id(),
             last_active_ms);

        if ( last_active_ms <=
                 (ulong)raft_server::raft_limits_.response_limit_ *
                 ctx_->get_params()->heart_beat_interval_ ) {
            resp->set_result_code(cmd_result_code::SERVER_IS_JOINING);
            return resp;
        }
        // Otherwise: activity timeout, reset the server.
        p_wn("activity timeout (last activity %" PRIu64 " ms ago), start over",
             last_active_ms);
        reset_srv_to_join();
    }

    conf_to_add_ = std::move(srv_conf);
    timer_task<int32>::executor exec =
        (timer_task<int32>::executor)
        std::bind( &raft_server::handle_hb_timeout,
                   this,
                   std::placeholders::_1 );
    srv_to_join_ = cs_new< peer,
                           ptr<srv_config>&,
                           context&,
                           timer_task<int32>::executor&,
                           ptr<logger>& >
                         ( conf_to_add_, *ctx_, exec, l_ );
    invite_srv_to_join_cluster();
    resp->accept(log_store_->next_slot());
    return resp;
}